

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

UBool icu_63::ICU_Utility::escapeUnprintable(UnicodeString *result,UChar32 c)

{
  UBool UVar1;
  UChar local_22;
  
  if (c - 0x20U < 0x5f) {
    UVar1 = '\0';
  }
  else {
    UnicodeString::doAppend(result,&local_22,0,1);
    if (0xffff < (uint)c) {
      UnicodeString::doAppend(result,&local_22,0,1);
      UnicodeString::doAppend(result,&local_22,0,1);
      UnicodeString::doAppend(result,&local_22,0,1);
      UnicodeString::doAppend(result,&local_22,0,1);
    }
    UnicodeString::doAppend(result,&local_22,0,1);
    UnicodeString::doAppend(result,&local_22,0,1);
    UnicodeString::doAppend(result,&local_22,0,1);
    UnicodeString::doAppend(result,&local_22,0,1);
    UnicodeString::doAppend(result,&local_22,0,1);
    UVar1 = '\x01';
  }
  return UVar1;
}

Assistant:

UBool ICU_Utility::escapeUnprintable(UnicodeString& result, UChar32 c) {
    if (isUnprintable(c)) {
        result.append(BACKSLASH);
        if (c & ~0xFFFF) {
            result.append(UPPER_U);
            result.append(DIGITS[0xF&(c>>28)]);
            result.append(DIGITS[0xF&(c>>24)]);
            result.append(DIGITS[0xF&(c>>20)]);
            result.append(DIGITS[0xF&(c>>16)]);
        } else {
            result.append(LOWER_U);
        }
        result.append(DIGITS[0xF&(c>>12)]);
        result.append(DIGITS[0xF&(c>>8)]);
        result.append(DIGITS[0xF&(c>>4)]);
        result.append(DIGITS[0xF&c]);
        return TRUE;
    }
    return FALSE;
}